

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,Request *req,Response *res,ContentReceiver *receiver,
          MultipartContentHeader *multipart_header,ContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  byte local_351;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_308;
  function<bool_(unsigned_long,_unsigned_long)> local_2e8;
  byte local_2c3;
  byte local_2c2;
  allocator local_2c1;
  string local_2c0;
  function<bool_(const_char_*,_unsigned_long)> local_2a0;
  anon_class_24_3_0ed7a2d1 local_280;
  uint local_264;
  undefined1 local_260 [8];
  string boundary;
  string local_238;
  string local_218;
  string *local_1f8;
  string *content_type;
  undefined1 local_1e0 [8];
  ContentReceiverWithProgress out;
  MultipartFormDataParser multipart_form_data_parser;
  MultipartContentHeader *multipart_header_local;
  ContentReceiver *receiver_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Server *this_local;
  
  detail::MultipartFormDataParser::MultipartFormDataParser
            ((MultipartFormDataParser *)&out._M_invoker);
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)local_1e0
            );
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,"Content-Type",
               (allocator *)(boundary.field_2._M_local_buf + 0xf));
    Request::get_header_value(&local_218,req,&local_238,0);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)(boundary.field_2._M_local_buf + 0xf));
    local_1f8 = &local_218;
    std::__cxx11::string::string((string *)local_260);
    bVar1 = detail::parse_multipart_boundary(local_1f8,(string *)local_260);
    if (bVar1) {
      detail::MultipartFormDataParser::set_boundary
                ((MultipartFormDataParser *)&out._M_invoker,(string *)local_260);
      local_280.multipart_form_data_parser = (MultipartFormDataParser *)&out._M_invoker;
      local_280.multipart_receiver = multipart_receiver;
      local_280.multipart_header = multipart_header;
      std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)local_1e0,
                 &local_280);
    }
    else {
      res->status = 400;
      this_local._7_1_ = 0;
    }
    local_264 = (uint)!bVar1;
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)&local_218);
    if (local_264 != 0) goto LAB_001c93f7;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::function(&local_2a0,receiver);
    std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
              ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)local_1e0,
               (anon_class_32_1_b7b80f6d *)&local_2a0);
    read_content_core(httplib::Stream&,httplib::Request&,httplib::Response&,std::function<bool(char_const*,unsigned_long)>,std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)
    ::{lambda(char_const*,unsigned_long,unsigned_long,unsigned_long)#2}::~function
              ((_lambda_char_const__unsigned_long_unsigned_long_unsigned_long__2_ *)&local_2a0);
  }
  bVar1 = std::operator==(&req->method,"DELETE");
  local_2c2 = 0;
  local_2c3 = 0;
  local_351 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_2c2 = 1;
    std::__cxx11::string::string((string *)&local_2c0,"Content-Length",&local_2c1);
    local_2c3 = 1;
    bVar1 = Request::has_header(req,&local_2c0);
    local_351 = bVar1 ^ 0xff;
  }
  if ((local_2c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((local_2c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  }
  if ((local_351 & 1) == 0) {
    payload_max_length = this->payload_max_length_;
    std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_2e8,(nullptr_t)0x0);
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
              (&local_308,
               (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               local_1e0);
    bVar1 = detail::read_content<httplib::Request>
                      (strm,req,payload_max_length,&res->status,&local_2e8,&local_308,true);
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
              (&local_308);
    std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_2e8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = Request::is_multipart_form_data(req);
      if ((!bVar1) ||
         (bVar1 = detail::MultipartFormDataParser::is_valid
                            ((MultipartFormDataParser *)&out._M_invoker), bVar1)) {
        this_local._7_1_ = 1;
        local_264 = 1;
      }
      else {
        res->status = 400;
        this_local._7_1_ = 0;
        local_264 = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      local_264 = 1;
    }
  }
  else {
    this_local._7_1_ = 1;
    local_264 = 1;
  }
LAB_001c93f7:
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)local_1e0
            );
  detail::MultipartFormDataParser::~MultipartFormDataParser
            ((MultipartFormDataParser *)&out._M_invoker);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::read_content_core(Stream &strm, Request &req, Response &res,
                                      ContentReceiver receiver,
                                      MultipartContentHeader multipart_header,
                                      ContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiverWithProgress out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return false;
    }

    multipart_form_data_parser.set_boundary(std::move(boundary));
    out = [&](const char *buf, size_t n, uint64_t /*off*/, uint64_t /*len*/) {
      /* For debug
      size_t pos = 0;
      while (pos < n) {
        auto read_size = (std::min)<size_t>(1, n - pos);
        auto ret = multipart_form_data_parser.parse(
            buf + pos, read_size, multipart_receiver, multipart_header);
        if (!ret) { return false; }
        pos += read_size;
      }
      return true;
      */
      return multipart_form_data_parser.parse(buf, n, multipart_receiver,
                                              multipart_header);
    };
  } else {
    out = [receiver](const char *buf, size_t n, uint64_t /*off*/,
                     uint64_t /*len*/) { return receiver(buf, n); };
  }

  if (req.method == "DELETE" && !req.has_header("Content-Length")) {
    return true;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status, nullptr,
                            out, true)) {
    return false;
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return false;
    }
  }

  return true;
}